

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall
libcellml::Generator::GeneratorImpl::updateVariableInfoSizes
          (GeneratorImpl *this,size_t *componentSize,size_t *nameSize,size_t *unitsSize,
          AnalyserVariablePtr *variable)

{
  element_type *this_00;
  long lVar1;
  element_type *this_01;
  element_type *this_02;
  ulong uVar2;
  ulong local_148;
  size_t local_140;
  size_t local_138;
  undefined1 local_f8 [16];
  string local_e8;
  ulong local_c8;
  size_type variableUnitsSize;
  ulong local_a0;
  size_type variableNameSize;
  shared_ptr<const_libcellml::ParentedEntity> local_88;
  shared_ptr<libcellml::Component> local_78;
  string local_68;
  ulong local_48;
  size_type variableComponentSize;
  VariablePtr variableVariable;
  AnalyserVariablePtr *variable_local;
  size_t *unitsSize_local;
  size_t *nameSize_local;
  size_t *componentSize_local;
  GeneratorImpl *this_local;
  
  variableVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)variable;
  std::__shared_ptr_access<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)variable);
  AnalyserVariable::variable((AnalyserVariable *)&variableComponentSize);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_88,
             (shared_ptr<libcellml::Variable> *)&variableComponentSize);
  owningComponent((libcellml *)&local_78,(ParentedEntityConstPtr *)&local_88);
  this_00 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_78);
  NamedEntity::name_abi_cxx11_(&local_68,(NamedEntity *)this_00);
  lVar1 = std::__cxx11::string::length();
  std::__cxx11::string::~string((string *)&local_68);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_78);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_88);
  local_48 = lVar1 + 1;
  this_01 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&variableComponentSize);
  NamedEntity::name_abi_cxx11_((string *)&variableUnitsSize,&this_01->super_NamedEntity);
  lVar1 = std::__cxx11::string::length();
  std::__cxx11::string::~string((string *)&variableUnitsSize);
  local_a0 = lVar1 + 1;
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &variableComponentSize);
  Variable::units((Variable *)local_f8);
  this_02 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_f8);
  NamedEntity::name_abi_cxx11_((string *)(local_f8 + 0x10),&this_02->super_NamedEntity);
  lVar1 = std::__cxx11::string::length();
  uVar2 = lVar1 + 1;
  std::__cxx11::string::~string((string *)(local_f8 + 0x10));
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_f8);
  if (local_48 < *componentSize) {
    local_138 = *componentSize;
  }
  else {
    local_138 = local_48;
  }
  *componentSize = local_138;
  if (local_a0 < *nameSize) {
    local_140 = *nameSize;
  }
  else {
    local_140 = local_a0;
  }
  *nameSize = local_140;
  local_148 = uVar2;
  if (uVar2 < *unitsSize) {
    local_148 = *unitsSize;
  }
  *unitsSize = local_148;
  local_c8 = uVar2;
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)&variableComponentSize);
  return;
}

Assistant:

void Generator::GeneratorImpl::updateVariableInfoSizes(size_t &componentSize,
                                                       size_t &nameSize,
                                                       size_t &unitsSize,
                                                       const AnalyserVariablePtr &variable) const
{
    auto variableVariable = variable->variable();
    auto variableComponentSize = owningComponent(variableVariable)->name().length() + 1;
    auto variableNameSize = variableVariable->name().length() + 1;
    auto variableUnitsSize = variableVariable->units()->name().length() + 1;
    // Note: +1 to account for the end of string termination.

    componentSize = (componentSize > variableComponentSize) ? componentSize : variableComponentSize;
    nameSize = (nameSize > variableNameSize) ? nameSize : variableNameSize;
    unitsSize = (unitsSize > variableUnitsSize) ? unitsSize : variableUnitsSize;
}